

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O0

void __thiscall llvm::DWARFDebugLine::Row::reset(Row *this,bool DefaultIsStmt)

{
  bool DefaultIsStmt_local;
  Row *this_local;
  
  (this->Address).Address = 0;
  (this->Address).SectionIndex = 0xffffffffffffffff;
  this->Line = 1;
  this->Column = 0;
  this->File = 1;
  this->Isa = '\0';
  this->Discriminator = 0;
  this->field_0x1d = this->field_0x1d & 0xfe | DefaultIsStmt;
  this->field_0x1d = this->field_0x1d & 0xfd;
  this->field_0x1d = this->field_0x1d & 0xfb;
  this->field_0x1d = this->field_0x1d & 0xf7;
  this->field_0x1d = this->field_0x1d & 0xef;
  return;
}

Assistant:

void DWARFDebugLine::Row::reset(bool DefaultIsStmt) {
  Address.Address = 0;
  Address.SectionIndex = object::SectionedAddress::UndefSection;
  Line = 1;
  Column = 0;
  File = 1;
  Isa = 0;
  Discriminator = 0;
  IsStmt = DefaultIsStmt;
  BasicBlock = false;
  EndSequence = false;
  PrologueEnd = false;
  EpilogueBegin = false;
}